

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O1

int readsettings(char *name)

{
  int iVar1;
  bool bVar2;
  int __fd;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_t __nbytes;
  char *__nptr;
  long lVar7;
  char fname [41];
  char buf [142];
  char local_f8 [48];
  undefined1 local_c8;
  char local_c7 [9];
  byte local_be;
  char acStack_bc [140];
  
  memset(&local_c8,0,0x8e);
  if (canfd_mode == 1) {
    builtin_strncpy(local_f8 + 8,"_fd.",5);
    __nbytes = 0x8d;
  }
  else {
    if (canfd_mode != 0) {
      puts("readsettings failed due to unspecified CAN FD mode");
      return -1;
    }
    local_f8[8] = '.';
    local_f8[9] = '\0';
    __nbytes = 0x1d;
  }
  builtin_strncpy(local_f8,"sniffset",8);
  sVar3 = strlen(local_f8);
  strncat(local_f8,name,0x28 - sVar3);
  __fd = open(local_f8,0);
  if (__fd < 1) {
    return -1;
  }
  idx = 0;
  do {
    sVar3 = read(__fd,&local_c8,__nbytes);
    if (sVar3 != __nbytes) break;
    uVar4 = strtoul(local_c7,(char **)0x0,0x10);
    lVar6 = (long)idx;
    sniftab[lVar6].current.can_id = (canid_t)uVar4;
    lVar5 = 7;
    if (max_dlen != '\0') {
      lVar5 = 0x3f;
    }
    sniftab[lVar6].flags = sniftab[lVar6].flags & 0xfffffffeU | local_be & 1;
    __nptr = acStack_bc + lVar5 * 2;
    lVar6 = lVar5 + 0x107298;
    lVar5 = lVar5 + 1;
    do {
      uVar4 = strtoul(__nptr,(char **)0x0,0x10);
      *(char *)(lVar6 + (long)idx * 0x158) = (char)uVar4;
      *__nptr = '\0';
      __nptr = __nptr + -2;
      lVar6 = lVar6 + -1;
      lVar7 = lVar5 + -1;
      bVar2 = 0 < lVar5;
      lVar5 = lVar7;
    } while (lVar7 != 0 && bVar2);
    iVar1 = idx + 1;
    bVar2 = idx < 0x7ff;
    idx = iVar1;
  } while (bVar2);
  close(__fd);
  return idx;
}

Assistant:

int readsettings(char* name)
{
	int fd;
	char fname[FNAME_MAX_LEN + 1];
	char buf[142] = {0};
	int entrylen;
	int j;
	bool done = false;

	if (canfd_mode == CANFD_OFF) {
		entrylen = 29;
		strcpy(fname, SETFNAME);
	} else if (canfd_mode == CANFD_ON) {
		entrylen = 141;
		strcpy(fname, SETFDFNAME);
	} else {
		printf("readsettings failed due to unspecified CAN FD mode\n");
		return -1;
	}

	strncat(fname, name, FNAME_MAX_LEN - strlen(fname));
	fd = open(fname, O_RDONLY);

	if (fd <= 0) {
		return -1;
	}
	idx = 0;
	while (!done) {
		if (read(fd, &buf, entrylen) != entrylen) {
			done = true;
			continue;
		}
		unsigned long id = strtoul(&buf[1], NULL, 16);

		sniftab[idx].current.can_id = id;

		if (buf[10] & 1)
			do_set(idx, ENABLE);
		else
			do_clr(idx, ENABLE);

		for (j = max_dlen - 1; j >= 0 ; j--) {
			sniftab[idx].notch.data[j] =
				(__u8) strtoul(&buf[2*j+12], NULL, 16) & 0xFF;
			buf[2*j+12] = 0; /* cut off each time */
		}

		if (++idx >= MAX_SLOTS)
			break;

	}
	close(fd);
	return idx;
}